

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

float __thiscall V2Moog::step(V2Moog *this,float realin,float f,float p,float q)

{
  float fVar1;
  float fVar2;
  float b4;
  float t3;
  float t2;
  float t1;
  float in;
  float q_local;
  float p_local;
  float f_local;
  float realin_local;
  V2Moog *this_local;
  
  fVar2 = this->b[1];
  this->b[1] = (-q * this->b[4] + realin + 3.8146973e-06 + this->b[0]) * p + -(this->b[1] * f);
  fVar1 = this->b[2];
  this->b[2] = (fVar2 + this->b[1]) * p + -(this->b[2] * f);
  fVar2 = this->b[3];
  this->b[3] = (fVar1 + this->b[2]) * p + -(this->b[3] * f);
  fVar2 = (fVar2 + this->b[3]) * p + -(this->b[4] * f);
  fVar2 = (-(fVar2 * fVar2 * fVar2) * 0.16666667 + fVar2) - 3.8146973e-06;
  this->b[4] = fVar2 - 3.8146973e-06;
  this->b[0] = realin;
  return fVar2;
}

Assistant:

float step(float realin, float f, float p, float q)
    {
        float in = realin + fcdcoffset; // again, biased in
        float t1, t2, t3, b4;

        in -= q * b[4]; // feedback
        t1 = b[1]; b[1] = (in + b[0]) * p - b[1] * f;
        t2 = b[2]; b[2] = (t1 + b[1]) * p - b[2] * f;
        t3 = b[3]; b[3] = (t2 + b[2]) * p - b[3] * f;
        b4   = (t3 + b[3]) * p - b[4] * f;

        b4 -= b4*b4*b4 * (1.0f/6.0f); // clipping
        b4 -= fcdcoffset; // un-bias
        b[4] = b4 - fcdcoffset;
        b[0] = realin;

        return b4;
    }